

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::dumpprivkey(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff9d8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff9e0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  allocator<char> *in_stack_fffffffffffffa18;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffffa20;
  RPCArgOptions *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  Fallback *in_stack_fffffffffffffa38;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa48;
  RPCArg *in_stack_fffffffffffffa50;
  RPCResults *in_stack_fffffffffffffa58;
  RPCResult *this_00;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  allocator<char> local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  pointer local_4e8;
  _Alloc_hider examples;
  pointer results;
  undefined8 in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  allocator<char> local_4a9 [8];
  allocator<char> local_4a1 [31];
  allocator<char> local_482;
  allocator<char> local_481 [193];
  RPCMethodImpl *in_stack_fffffffffffffc40;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_4a9[1] = (allocator<char>)0x0;
  local_4a9[2] = (allocator<char>)0x0;
  local_4a9[3] = (allocator<char>)0x0;
  local_4a9[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff9e8,(Optional *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::__cxx11::string::string(in_stack_fffffffffffff9f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9d8);
  RPCArg::RPCArg(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (Type)((ulong)in_stack_fffffffffffffa40 >> 0x20),in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffa38 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff9d8);
  __l._M_len = (size_type)in_stack_fffffffffffffa28;
  __l._M_array = in_stack_fffffffffffffa20;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa18,__l,
             (allocator_type *)in_stack_fffffffffffffa10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_4e8 = (pointer)0x0;
  examples._M_p = (pointer)0x0;
  results = (pointer)0x0;
  this_00 = (RPCResult *)&local_4e8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9d8);
  RPCResult::RPCResult
            (this_00,(Type)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             &in_stack_fffffffffffffa50->m_names,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffffa58,(RPCResult *)in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  HelpExampleCli(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  HelpExampleCli(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  std::operator+(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  HelpExampleRpc(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  std::operator+(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff9d8,(string *)0x15c42c4);
  this = (RPCArg *)&stack0xfffffffffffffaf0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::dumpprivkey()::__0,void>(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb30,
             (RPCResults *)results,(RPCExamples *)examples._M_p,in_stack_fffffffffffffc40);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ee);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ed);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ec);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4eb);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4e9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb36);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb37);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff9e8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_4a9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_4a1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_482);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_481);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan dumpprivkey()
{
    return RPCHelpMan{"dumpprivkey",
                "\nReveals the private key corresponding to 'address'.\n"
                "Then the importprivkey can be used with this output\n"
                "Note: This command is only compatible with legacy wallets.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address for the private key"},
                },
                RPCResult{
                    RPCResult::Type::STR, "key", "The private key"
                },
                RPCExamples{
                    HelpExampleCli("dumpprivkey", "\"myaddress\"")
            + HelpExampleCli("importprivkey", "\"mykey\"")
            + HelpExampleRpc("dumpprivkey", "\"myaddress\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const LegacyScriptPubKeyMan& spk_man = EnsureConstLegacyScriptPubKeyMan(*pwallet);

    LOCK2(pwallet->cs_wallet, spk_man.cs_KeyStore);

    EnsureWalletIsUnlocked(*pwallet);

    std::string strAddress = request.params[0].get_str();
    CTxDestination dest = DecodeDestination(strAddress);
    if (!IsValidDestination(dest)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid Bitcoin address");
    }
    auto keyid = GetKeyForDestination(spk_man, dest);
    if (keyid.IsNull()) {
        throw JSONRPCError(RPC_TYPE_ERROR, "Address does not refer to a key");
    }
    CKey vchSecret;
    if (!spk_man.GetKey(keyid, vchSecret)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Private key for address " + strAddress + " is not known");
    }
    return EncodeSecret(vchSecret);
},
    };
}